

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void fadst16x16_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w0_04;
  __m256i w0_05;
  __m256i w0_06;
  __m256i w0_07;
  __m256i w0_08;
  __m256i w0_09;
  __m256i w0_10;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w1_04;
  __m256i w1_05;
  __m256i w1_06;
  __m256i w1_07;
  __m256i w1_08;
  __m256i w1_09;
  __m256i w1_10;
  __m256i w1_11;
  __m256i w1_12;
  __m256i w1_13;
  __m256i w1_14;
  __m256i w1_15;
  __m256i w1_16;
  __m256i w1_17;
  __m256i w1_18;
  __m256i _r;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  __m256i _r_07;
  __m256i _r_08;
  __m256i _r_09;
  __m256i _r_10;
  __m256i _r_11;
  __m256i _r_12;
  __m256i _r_13;
  __m256i _r_14;
  __m256i _r_15;
  __m256i _r_16;
  __m256i _r_17;
  __m256i _r_18;
  int iVar9;
  uint uVar10;
  int cos_bit_00;
  undefined7 in_register_00000011;
  uint uVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [32];
  __m256i x1 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 in_stack_fffffffffffffa20 [16];
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  __m256i local_5a0;
  __m256i local_580;
  __m256i local_560;
  __m256i local_540;
  __m256i local_520;
  __m256i local_500;
  __m256i local_4e0;
  __m256i local_4c0;
  __m256i local_4a0;
  __m256i local_480;
  __m256i local_460;
  __m256i local_440;
  __m256i local_420;
  __m256i local_400;
  __m256i local_3e0;
  __m256i local_3c0;
  int local_3a0;
  int iStack_39c;
  int iStack_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int iStack_388;
  int iStack_384;
  int local_380;
  int iStack_37c;
  int iStack_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int iStack_368;
  int iStack_364;
  int local_360;
  int iStack_35c;
  int iStack_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int iStack_348;
  int iStack_344;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  int local_2e0;
  int iStack_2dc;
  int iStack_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int iStack_2c4;
  int local_2c0;
  int iStack_2bc;
  int iStack_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int iStack_2a8;
  int iStack_2a4;
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  uint local_280;
  uint uStack_27c;
  uint uStack_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint uStack_268;
  uint uStack_264;
  int local_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  uint local_240;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  int local_1e0;
  int iStack_1dc;
  int iStack_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int iStack_1c8;
  int iStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  int local_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int iStack_188;
  int iStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  int local_160;
  int iStack_15c;
  int iStack_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int iStack_148;
  int iStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  int local_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  cos_bit_00 = (int)CONCAT71(in_register_00000011,cos_bit);
  lVar12 = (long)cos_bit_00;
  lVar13 = lVar12 * 0x100;
  iVar9 = 1 << (cos_bit - 1U & 0x1f);
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  uVar10 = uVar22 & 0xffff;
  local_3a0 = uVar10 * 0x10001;
  local_380 = uVar10 + uVar22 * -0x10000;
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  uVar11 = uVar10 << 0x10 | uVar22 & 0xffff;
  local_360 = (uVar10 & 0xffff) + uVar22 * -0x10000;
  local_340 = -uVar10 & 0xffff | uVar22 * 0x10000;
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x180);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x240);
  local_320 = uVar10 << 0x10 | uVar22 & 0xffff;
  local_2e0 = (uVar10 & 0xffff) + uVar22 * -0x10000;
  uVar23 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x200);
  uVar24 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1c0);
  local_300 = uVar24 << 0x10 | uVar23 & 0xffff;
  local_2c0 = (uVar24 & 0xffff) + uVar23 * -0x10000;
  local_2a0 = -uVar10 & 0xffff | uVar22 * 0x10000;
  local_280 = -uVar24 & 0xffff | uVar23 * 0x10000;
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 600);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x168);
  local_240 = uVar22 << 0x10 | uVar10 & 0xffff;
  local_260 = (uVar22 & 0xffff) + uVar10 * -0x10000;
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x188);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x238);
  local_5a0 = *input;
  auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  local_580 = (__m256i)vpsubsw_avx2(auVar14,(undefined1  [32])input[0xf]);
  local_560 = (__m256i)vpsubsw_avx2(auVar14,(undefined1  [32])input[7]);
  local_200 = uVar10 << 0x10 | uVar22 & 0xffff;
  local_540 = input[8];
  local_520 = (__m256i)vpsubsw_avx2(auVar14,(undefined1  [32])input[3]);
  local_500 = input[0xc];
  local_4e0 = input[4];
  local_4c0 = (__m256i)vpsubsw_avx2(auVar14,(undefined1  [32])input[0xb]);
  local_4a0 = (__m256i)vpsubsw_avx2(auVar14,(undefined1  [32])input[1]);
  local_480 = input[0xe];
  local_460 = input[6];
  local_440 = (__m256i)vpsubsw_avx2(auVar14,(undefined1  [32])input[9]);
  local_420 = input[2];
  local_400 = (__m256i)vpsubsw_avx2(auVar14,(undefined1  [32])input[0xd]);
  local_220 = (uVar10 & 0xffff) + uVar22 * -0x10000;
  local_3e0 = (__m256i)vpsubsw_avx2(auVar14,(undefined1  [32])input[5]);
  local_3c0 = input[10];
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1a8);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x218);
  local_1c0 = uVar10 << 0x10 | uVar22 & 0xffff;
  local_1e0 = (uVar10 & 0xffff) + uVar22 * -0x10000;
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1c8);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1f8);
  local_180 = uVar10 << 0x10 | uVar22 & 0xffff;
  local_1a0 = (uVar10 & 0xffff) + uVar22 * -0x10000;
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1e8);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1d8);
  local_140 = uVar10 << 0x10 | uVar22 & 0xffff;
  local_160 = (uVar10 & 0xffff) + uVar22 * -0x10000;
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x208);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1b8);
  local_100 = uVar10 << 0x10 | uVar22 & 0xffff;
  local_120 = (uVar10 & 0xffff) + uVar22 * -0x10000;
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x228);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x198);
  local_c0 = uVar10 << 0x10 | uVar22 & 0xffff;
  local_e0 = (uVar10 & 0xffff) + uVar22 * -0x10000;
  uVar22 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x178);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x248);
  local_80 = uVar22 << 0x10 | uVar10 & 0xffff;
  local_a0 = (uVar22 & 0xffff) + uVar10 * -0x10000;
  alVar1[0]._4_4_ = iVar9;
  alVar1[0]._0_4_ = iVar9;
  alVar1[1]._0_4_ = iVar9;
  alVar1[1]._4_4_ = iVar9;
  alVar1[2]._0_4_ = iVar9;
  alVar1[2]._4_4_ = iVar9;
  alVar1[3]._0_4_ = iVar9;
  alVar1[3]._4_4_ = iVar9;
  w1[2] = lVar12;
  w1._0_16_ = in_stack_fffffffffffffa20;
  w1[3] = (longlong)output;
  _r[0]._4_4_ = uVar11;
  _r[0]._0_4_ = uVar11;
  _r[1]._0_4_ = uVar11;
  _r[1]._4_4_ = uVar11;
  _r[2]._0_4_ = uVar11;
  _r[2]._4_4_ = uVar11;
  _r[3]._0_4_ = uVar11;
  _r[3]._4_4_ = uVar11;
  iVar15 = iVar9;
  iVar16 = iVar9;
  iVar17 = iVar9;
  iVar18 = iVar9;
  iVar19 = iVar9;
  iVar20 = iVar9;
  iVar21 = iVar9;
  uVar22 = uVar11;
  uVar10 = uVar11;
  uVar23 = uVar11;
  uVar24 = uVar11;
  uVar25 = uVar11;
  uVar26 = uVar11;
  uVar27 = uVar11;
  iStack_39c = local_3a0;
  iStack_398 = local_3a0;
  iStack_394 = local_3a0;
  iStack_390 = local_3a0;
  iStack_38c = local_3a0;
  iStack_388 = local_3a0;
  iStack_384 = local_3a0;
  iStack_37c = local_380;
  iStack_378 = local_380;
  iStack_374 = local_380;
  iStack_370 = local_380;
  iStack_36c = local_380;
  iStack_368 = local_380;
  iStack_364 = local_380;
  iStack_35c = local_360;
  iStack_358 = local_360;
  iStack_354 = local_360;
  iStack_350 = local_360;
  iStack_34c = local_360;
  iStack_348 = local_360;
  iStack_344 = local_360;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  uStack_31c = local_320;
  uStack_318 = local_320;
  uStack_314 = local_320;
  uStack_310 = local_320;
  uStack_30c = local_320;
  uStack_308 = local_320;
  uStack_304 = local_320;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  iStack_2dc = local_2e0;
  iStack_2d8 = local_2e0;
  iStack_2d4 = local_2e0;
  iStack_2d0 = local_2e0;
  iStack_2cc = local_2e0;
  iStack_2c8 = local_2e0;
  iStack_2c4 = local_2e0;
  iStack_2bc = local_2c0;
  iStack_2b8 = local_2c0;
  iStack_2b4 = local_2c0;
  iStack_2b0 = local_2c0;
  iStack_2ac = local_2c0;
  iStack_2a8 = local_2c0;
  iStack_2a4 = local_2c0;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  iStack_25c = local_260;
  iStack_258 = local_260;
  iStack_254 = local_260;
  iStack_250 = local_260;
  iStack_24c = local_260;
  iStack_248 = local_260;
  iStack_244 = local_260;
  uStack_23c = local_240;
  uStack_238 = local_240;
  uStack_234 = local_240;
  uStack_230 = local_240;
  uStack_22c = local_240;
  uStack_228 = local_240;
  uStack_224 = local_240;
  iStack_21c = local_220;
  iStack_218 = local_220;
  iStack_214 = local_220;
  iStack_210 = local_220;
  iStack_20c = local_220;
  iStack_208 = local_220;
  iStack_204 = local_220;
  uStack_1fc = local_200;
  uStack_1f8 = local_200;
  uStack_1f4 = local_200;
  uStack_1f0 = local_200;
  uStack_1ec = local_200;
  uStack_1e8 = local_200;
  uStack_1e4 = local_200;
  iStack_1dc = local_1e0;
  iStack_1d8 = local_1e0;
  iStack_1d4 = local_1e0;
  iStack_1d0 = local_1e0;
  iStack_1cc = local_1e0;
  iStack_1c8 = local_1e0;
  iStack_1c4 = local_1e0;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  iStack_19c = local_1a0;
  iStack_198 = local_1a0;
  iStack_194 = local_1a0;
  iStack_190 = local_1a0;
  iStack_18c = local_1a0;
  iStack_188 = local_1a0;
  iStack_184 = local_1a0;
  uStack_17c = local_180;
  uStack_178 = local_180;
  uStack_174 = local_180;
  uStack_170 = local_180;
  uStack_16c = local_180;
  uStack_168 = local_180;
  uStack_164 = local_180;
  iStack_15c = local_160;
  iStack_158 = local_160;
  iStack_154 = local_160;
  iStack_150 = local_160;
  iStack_14c = local_160;
  iStack_148 = local_160;
  iStack_144 = local_160;
  uStack_13c = local_140;
  uStack_138 = local_140;
  uStack_134 = local_140;
  uStack_130 = local_140;
  uStack_12c = local_140;
  uStack_128 = local_140;
  uStack_124 = local_140;
  iStack_11c = local_120;
  iStack_118 = local_120;
  iStack_114 = local_120;
  iStack_110 = local_120;
  iStack_10c = local_120;
  iStack_108 = local_120;
  iStack_104 = local_120;
  uStack_fc = local_100;
  uStack_f8 = local_100;
  uStack_f4 = local_100;
  uStack_f0 = local_100;
  uStack_ec = local_100;
  uStack_e8 = local_100;
  uStack_e4 = local_100;
  iStack_dc = local_e0;
  iStack_d8 = local_e0;
  iStack_d4 = local_e0;
  iStack_d0 = local_e0;
  iStack_cc = local_e0;
  iStack_c8 = local_e0;
  iStack_c4 = local_e0;
  uStack_bc = local_c0;
  uStack_b8 = local_c0;
  uStack_b4 = local_c0;
  uStack_b0 = local_c0;
  uStack_ac = local_c0;
  uStack_a8 = local_c0;
  uStack_a4 = local_c0;
  iStack_9c = local_a0;
  iStack_98 = local_a0;
  iStack_94 = local_a0;
  iStack_90 = local_a0;
  iStack_8c = local_a0;
  iStack_88 = local_a0;
  iStack_84 = local_a0;
  uStack_7c = local_80;
  uStack_78 = local_80;
  uStack_74 = local_80;
  uStack_70 = local_80;
  uStack_6c = local_80;
  uStack_68 = local_80;
  uStack_64 = local_80;
  btf_16_w16_avx2(alVar1,w1,&local_560,&local_540,_r,cos_bit_00);
  alVar2[0]._4_4_ = iVar15;
  alVar2[0]._0_4_ = iVar9;
  alVar2[1]._0_4_ = iVar16;
  alVar2[1]._4_4_ = iVar17;
  alVar2[2]._0_4_ = iVar18;
  alVar2[2]._4_4_ = iVar19;
  alVar2[3]._0_4_ = iVar20;
  alVar2[3]._4_4_ = iVar21;
  w1_00[2] = lVar12;
  w1_00[0] = in_stack_fffffffffffffa20._0_8_;
  w1_00[1] = in_stack_fffffffffffffa20._8_8_;
  w1_00[3] = (longlong)output;
  _r_00[0]._4_4_ = uVar22;
  _r_00[0]._0_4_ = uVar11;
  _r_00[1]._0_4_ = uVar10;
  _r_00[1]._4_4_ = uVar23;
  _r_00[2]._0_4_ = uVar24;
  _r_00[2]._4_4_ = uVar25;
  _r_00[3]._0_4_ = uVar26;
  _r_00[3]._4_4_ = uVar27;
  btf_16_w16_avx2(alVar2,w1_00,&local_4e0,&local_4c0,_r_00,cos_bit_00);
  alVar3[0]._4_4_ = iVar15;
  alVar3[0]._0_4_ = iVar9;
  alVar3[1]._0_4_ = iVar16;
  alVar3[1]._4_4_ = iVar17;
  alVar3[2]._0_4_ = iVar18;
  alVar3[2]._4_4_ = iVar19;
  alVar3[3]._0_4_ = iVar20;
  alVar3[3]._4_4_ = iVar21;
  w1_01[2] = lVar12;
  w1_01[0] = in_stack_fffffffffffffa20._0_8_;
  w1_01[1] = in_stack_fffffffffffffa20._8_8_;
  w1_01[3] = (longlong)output;
  _r_01[0]._4_4_ = uVar22;
  _r_01[0]._0_4_ = uVar11;
  _r_01[1]._0_4_ = uVar10;
  _r_01[1]._4_4_ = uVar23;
  _r_01[2]._0_4_ = uVar24;
  _r_01[2]._4_4_ = uVar25;
  _r_01[3]._0_4_ = uVar26;
  _r_01[3]._4_4_ = uVar27;
  btf_16_w16_avx2(alVar3,w1_01,&local_460,&local_440,_r_01,cos_bit_00);
  alVar4[0]._4_4_ = iVar15;
  alVar4[0]._0_4_ = iVar9;
  alVar4[1]._0_4_ = iVar16;
  alVar4[1]._4_4_ = iVar17;
  alVar4[2]._0_4_ = iVar18;
  alVar4[2]._4_4_ = iVar19;
  alVar4[3]._0_4_ = iVar20;
  alVar4[3]._4_4_ = iVar21;
  w1_02[2] = lVar12;
  w1_02[0] = in_stack_fffffffffffffa20._0_8_;
  w1_02[1] = in_stack_fffffffffffffa20._8_8_;
  w1_02[3] = (longlong)output;
  _r_02[0]._4_4_ = uVar22;
  _r_02[0]._0_4_ = uVar11;
  _r_02[1]._0_4_ = uVar10;
  _r_02[1]._4_4_ = uVar23;
  _r_02[2]._0_4_ = uVar24;
  _r_02[2]._4_4_ = uVar25;
  _r_02[3]._0_4_ = uVar26;
  _r_02[3]._4_4_ = uVar27;
  btf_16_w16_avx2(alVar4,w1_02,&local_3e0,&local_3c0,_r_02,cos_bit_00);
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_560);
  local_560 = (__m256i)vpsubsw_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_560);
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_540);
  local_540 = (__m256i)vpsubsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_540);
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])local_520,(undefined1  [32])local_4e0);
  local_4e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_520,(undefined1  [32])local_4e0);
  alVar4 = (__m256i)vpaddsw_avx2((undefined1  [32])local_500,(undefined1  [32])local_4c0);
  local_4c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_500,(undefined1  [32])local_4c0);
  alVar5 = (__m256i)vpaddsw_avx2((undefined1  [32])local_4a0,(undefined1  [32])local_460);
  local_460 = (__m256i)vpsubsw_avx2((undefined1  [32])local_4a0,(undefined1  [32])local_460);
  alVar6 = (__m256i)vpaddsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_440);
  local_440 = (__m256i)vpsubsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_440);
  alVar7 = (__m256i)vpaddsw_avx2((undefined1  [32])local_420,(undefined1  [32])local_3e0);
  local_3e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_420,(undefined1  [32])local_3e0);
  alVar8 = (__m256i)vpaddsw_avx2((undefined1  [32])local_400,(undefined1  [32])local_3c0);
  local_3c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_400,(undefined1  [32])local_3c0);
  w0[0]._4_4_ = iVar15;
  w0[0]._0_4_ = iVar9;
  w0[1]._0_4_ = iVar16;
  w0[1]._4_4_ = iVar17;
  w0[2]._0_4_ = iVar18;
  w0[2]._4_4_ = iVar19;
  w0[3]._0_4_ = iVar20;
  w0[3]._4_4_ = iVar21;
  w1_03[2] = lVar12;
  w1_03[0] = in_stack_fffffffffffffa20._0_8_;
  w1_03[1] = in_stack_fffffffffffffa20._8_8_;
  w1_03[3] = (longlong)output;
  _r_03[0]._4_4_ = uVar22;
  _r_03[0]._0_4_ = uVar11;
  _r_03[1]._0_4_ = uVar10;
  _r_03[1]._4_4_ = uVar23;
  _r_03[2]._0_4_ = uVar24;
  _r_03[2]._4_4_ = uVar25;
  _r_03[3]._0_4_ = uVar26;
  _r_03[3]._4_4_ = uVar27;
  local_5a0 = alVar1;
  local_580 = alVar2;
  local_520 = alVar3;
  local_500 = alVar4;
  local_4a0 = alVar5;
  local_480 = alVar6;
  local_420 = alVar7;
  local_400 = alVar8;
  btf_16_w16_avx2(w0,w1_03,&local_520,&local_500,_r_03,cos_bit_00);
  alVar5[0]._4_4_ = iVar15;
  alVar5[0]._0_4_ = iVar9;
  alVar5[1]._0_4_ = iVar16;
  alVar5[1]._4_4_ = iVar17;
  alVar5[2]._0_4_ = iVar18;
  alVar5[2]._4_4_ = iVar19;
  alVar5[3]._0_4_ = iVar20;
  alVar5[3]._4_4_ = iVar21;
  w1_04[2] = lVar12;
  w1_04[0] = in_stack_fffffffffffffa20._0_8_;
  w1_04[1] = in_stack_fffffffffffffa20._8_8_;
  w1_04[3] = (longlong)output;
  _r_04[0]._4_4_ = uVar22;
  _r_04[0]._0_4_ = uVar11;
  _r_04[1]._0_4_ = uVar10;
  _r_04[1]._4_4_ = uVar23;
  _r_04[2]._0_4_ = uVar24;
  _r_04[2]._4_4_ = uVar25;
  _r_04[3]._0_4_ = uVar26;
  _r_04[3]._4_4_ = uVar27;
  btf_16_w16_avx2(alVar5,w1_04,&local_4e0,&local_4c0,_r_04,cos_bit_00);
  alVar6[0]._4_4_ = iVar15;
  alVar6[0]._0_4_ = iVar9;
  alVar6[1]._0_4_ = iVar16;
  alVar6[1]._4_4_ = iVar17;
  alVar6[2]._0_4_ = iVar18;
  alVar6[2]._4_4_ = iVar19;
  alVar6[3]._0_4_ = iVar20;
  alVar6[3]._4_4_ = iVar21;
  w1_05[2] = lVar12;
  w1_05[0] = in_stack_fffffffffffffa20._0_8_;
  w1_05[1] = in_stack_fffffffffffffa20._8_8_;
  w1_05[3] = (longlong)output;
  _r_05[0]._4_4_ = uVar22;
  _r_05[0]._0_4_ = uVar11;
  _r_05[1]._0_4_ = uVar10;
  _r_05[1]._4_4_ = uVar23;
  _r_05[2]._0_4_ = uVar24;
  _r_05[2]._4_4_ = uVar25;
  _r_05[3]._0_4_ = uVar26;
  _r_05[3]._4_4_ = uVar27;
  btf_16_w16_avx2(alVar6,w1_05,&local_420,&local_400,_r_05,cos_bit_00);
  alVar7[0]._4_4_ = iVar15;
  alVar7[0]._0_4_ = iVar9;
  alVar7[1]._0_4_ = iVar16;
  alVar7[1]._4_4_ = iVar17;
  alVar7[2]._0_4_ = iVar18;
  alVar7[2]._4_4_ = iVar19;
  alVar7[3]._0_4_ = iVar20;
  alVar7[3]._4_4_ = iVar21;
  w1_06[2] = lVar12;
  w1_06[0] = in_stack_fffffffffffffa20._0_8_;
  w1_06[1] = in_stack_fffffffffffffa20._8_8_;
  w1_06[3] = (longlong)output;
  _r_06[0]._4_4_ = uVar22;
  _r_06[0]._0_4_ = uVar11;
  _r_06[1]._0_4_ = uVar10;
  _r_06[1]._4_4_ = uVar23;
  _r_06[2]._0_4_ = uVar24;
  _r_06[2]._4_4_ = uVar25;
  _r_06[3]._0_4_ = uVar26;
  _r_06[3]._4_4_ = uVar27;
  btf_16_w16_avx2(alVar7,w1_06,&local_3e0,&local_3c0,_r_06,cos_bit_00);
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_520);
  local_520 = (__m256i)vpsubsw_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_520);
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_500);
  local_500 = (__m256i)vpsubsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_500);
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])local_560,(undefined1  [32])local_4e0);
  local_4e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_560,(undefined1  [32])local_4e0);
  alVar4 = (__m256i)vpaddsw_avx2((undefined1  [32])local_540,(undefined1  [32])local_4c0);
  local_4c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_540,(undefined1  [32])local_4c0);
  alVar5 = (__m256i)vpaddsw_avx2((undefined1  [32])local_4a0,(undefined1  [32])local_420);
  local_420 = (__m256i)vpsubsw_avx2((undefined1  [32])local_4a0,(undefined1  [32])local_420);
  alVar6 = (__m256i)vpaddsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_400);
  local_400 = (__m256i)vpsubsw_avx2((undefined1  [32])local_480,(undefined1  [32])local_400);
  alVar7 = (__m256i)vpaddsw_avx2((undefined1  [32])local_460,(undefined1  [32])local_3e0);
  local_3e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_460,(undefined1  [32])local_3e0);
  alVar8 = (__m256i)vpaddsw_avx2((undefined1  [32])local_440,(undefined1  [32])local_3c0);
  local_3c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_440,(undefined1  [32])local_3c0);
  w0_00[0]._4_4_ = iVar15;
  w0_00[0]._0_4_ = iVar9;
  w0_00[1]._0_4_ = iVar16;
  w0_00[1]._4_4_ = iVar17;
  w0_00[2]._0_4_ = iVar18;
  w0_00[2]._4_4_ = iVar19;
  w0_00[3]._0_4_ = iVar20;
  w0_00[3]._4_4_ = iVar21;
  w1_07[2] = lVar12;
  w1_07[0] = in_stack_fffffffffffffa20._0_8_;
  w1_07[1] = in_stack_fffffffffffffa20._8_8_;
  w1_07[3] = (longlong)output;
  _r_07[0]._4_4_ = uVar22;
  _r_07[0]._0_4_ = uVar11;
  _r_07[1]._0_4_ = uVar10;
  _r_07[1]._4_4_ = uVar23;
  _r_07[2]._0_4_ = uVar24;
  _r_07[2]._4_4_ = uVar25;
  _r_07[3]._0_4_ = uVar26;
  _r_07[3]._4_4_ = uVar27;
  local_5a0 = alVar1;
  local_580 = alVar2;
  local_560 = alVar3;
  local_540 = alVar4;
  local_4a0 = alVar5;
  local_480 = alVar6;
  local_460 = alVar7;
  local_440 = alVar8;
  btf_16_w16_avx2(w0_00,w1_07,&local_4a0,&local_480,_r_07,cos_bit_00);
  alVar8[0]._4_4_ = iVar15;
  alVar8[0]._0_4_ = iVar9;
  alVar8[1]._0_4_ = iVar16;
  alVar8[1]._4_4_ = iVar17;
  alVar8[2]._0_4_ = iVar18;
  alVar8[2]._4_4_ = iVar19;
  alVar8[3]._0_4_ = iVar20;
  alVar8[3]._4_4_ = iVar21;
  w1_08[2] = lVar12;
  w1_08[0] = in_stack_fffffffffffffa20._0_8_;
  w1_08[1] = in_stack_fffffffffffffa20._8_8_;
  w1_08[3] = (longlong)output;
  _r_08[0]._4_4_ = uVar22;
  _r_08[0]._0_4_ = uVar11;
  _r_08[1]._0_4_ = uVar10;
  _r_08[1]._4_4_ = uVar23;
  _r_08[2]._0_4_ = uVar24;
  _r_08[2]._4_4_ = uVar25;
  _r_08[3]._0_4_ = uVar26;
  _r_08[3]._4_4_ = uVar27;
  btf_16_w16_avx2(alVar8,w1_08,&local_460,&local_440,_r_08,cos_bit_00);
  w0_01[0]._4_4_ = iVar15;
  w0_01[0]._0_4_ = iVar9;
  w0_01[1]._0_4_ = iVar16;
  w0_01[1]._4_4_ = iVar17;
  w0_01[2]._0_4_ = iVar18;
  w0_01[2]._4_4_ = iVar19;
  w0_01[3]._0_4_ = iVar20;
  w0_01[3]._4_4_ = iVar21;
  w1_09[2] = lVar12;
  w1_09[0] = in_stack_fffffffffffffa20._0_8_;
  w1_09[1] = in_stack_fffffffffffffa20._8_8_;
  w1_09[3] = (longlong)output;
  _r_09[0]._4_4_ = uVar22;
  _r_09[0]._0_4_ = uVar11;
  _r_09[1]._0_4_ = uVar10;
  _r_09[1]._4_4_ = uVar23;
  _r_09[2]._0_4_ = uVar24;
  _r_09[2]._4_4_ = uVar25;
  _r_09[3]._0_4_ = uVar26;
  _r_09[3]._4_4_ = uVar27;
  btf_16_w16_avx2(w0_01,w1_09,&local_420,&local_400,_r_09,cos_bit_00);
  w0_02[0]._4_4_ = iVar15;
  w0_02[0]._0_4_ = iVar9;
  w0_02[1]._0_4_ = iVar16;
  w0_02[1]._4_4_ = iVar17;
  w0_02[2]._0_4_ = iVar18;
  w0_02[2]._4_4_ = iVar19;
  w0_02[3]._0_4_ = iVar20;
  w0_02[3]._4_4_ = iVar21;
  w1_10[2] = lVar12;
  w1_10[0] = in_stack_fffffffffffffa20._0_8_;
  w1_10[1] = in_stack_fffffffffffffa20._8_8_;
  w1_10[3] = (longlong)output;
  _r_10[0]._4_4_ = uVar22;
  _r_10[0]._0_4_ = uVar11;
  _r_10[1]._0_4_ = uVar10;
  _r_10[1]._4_4_ = uVar23;
  _r_10[2]._0_4_ = uVar24;
  _r_10[2]._4_4_ = uVar25;
  _r_10[3]._0_4_ = uVar26;
  _r_10[3]._4_4_ = uVar27;
  btf_16_w16_avx2(w0_02,w1_10,&local_3e0,&local_3c0,_r_10,cos_bit_00);
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_4a0);
  local_4a0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_4a0);
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_480);
  local_480 = (__m256i)vpsubsw_avx2((undefined1  [32])local_580,(undefined1  [32])local_480);
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])local_560,(undefined1  [32])local_460);
  local_460 = (__m256i)vpsubsw_avx2((undefined1  [32])local_560,(undefined1  [32])local_460);
  alVar4 = (__m256i)vpaddsw_avx2((undefined1  [32])local_540,(undefined1  [32])local_440);
  local_440 = (__m256i)vpsubsw_avx2((undefined1  [32])local_540,(undefined1  [32])local_440);
  alVar5 = (__m256i)vpaddsw_avx2((undefined1  [32])local_520,(undefined1  [32])local_420);
  local_420 = (__m256i)vpsubsw_avx2((undefined1  [32])local_520,(undefined1  [32])local_420);
  alVar6 = (__m256i)vpaddsw_avx2((undefined1  [32])local_500,(undefined1  [32])local_400);
  local_400 = (__m256i)vpsubsw_avx2((undefined1  [32])local_500,(undefined1  [32])local_400);
  alVar7 = (__m256i)vpaddsw_avx2((undefined1  [32])local_4e0,(undefined1  [32])local_3e0);
  local_3e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_4e0,(undefined1  [32])local_3e0);
  alVar8 = (__m256i)vpaddsw_avx2((undefined1  [32])local_4c0,(undefined1  [32])local_3c0);
  local_3c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_4c0,(undefined1  [32])local_3c0);
  w0_03[0]._4_4_ = iVar15;
  w0_03[0]._0_4_ = iVar9;
  w0_03[1]._0_4_ = iVar16;
  w0_03[1]._4_4_ = iVar17;
  w0_03[2]._0_4_ = iVar18;
  w0_03[2]._4_4_ = iVar19;
  w0_03[3]._0_4_ = iVar20;
  w0_03[3]._4_4_ = iVar21;
  w1_11[2] = lVar12;
  w1_11[0] = in_stack_fffffffffffffa20._0_8_;
  w1_11[1] = in_stack_fffffffffffffa20._8_8_;
  w1_11[3] = (longlong)output;
  _r_11[0]._4_4_ = uVar22;
  _r_11[0]._0_4_ = uVar11;
  _r_11[1]._0_4_ = uVar10;
  _r_11[1]._4_4_ = uVar23;
  _r_11[2]._0_4_ = uVar24;
  _r_11[2]._4_4_ = uVar25;
  _r_11[3]._0_4_ = uVar26;
  _r_11[3]._4_4_ = uVar27;
  local_5a0 = alVar1;
  local_580 = alVar2;
  local_560 = alVar3;
  local_540 = alVar4;
  local_520 = alVar5;
  local_500 = alVar6;
  local_4e0 = alVar7;
  local_4c0 = alVar8;
  btf_16_w16_avx2(w0_03,w1_11,&local_5a0,&local_580,_r_11,cos_bit_00);
  w0_04[0]._4_4_ = iVar15;
  w0_04[0]._0_4_ = iVar9;
  w0_04[1]._0_4_ = iVar16;
  w0_04[1]._4_4_ = iVar17;
  w0_04[2]._0_4_ = iVar18;
  w0_04[2]._4_4_ = iVar19;
  w0_04[3]._0_4_ = iVar20;
  w0_04[3]._4_4_ = iVar21;
  w1_12[2] = lVar12;
  w1_12[0] = in_stack_fffffffffffffa20._0_8_;
  w1_12[1] = in_stack_fffffffffffffa20._8_8_;
  w1_12[3] = (longlong)output;
  _r_12[0]._4_4_ = uVar22;
  _r_12[0]._0_4_ = uVar11;
  _r_12[1]._0_4_ = uVar10;
  _r_12[1]._4_4_ = uVar23;
  _r_12[2]._0_4_ = uVar24;
  _r_12[2]._4_4_ = uVar25;
  _r_12[3]._0_4_ = uVar26;
  _r_12[3]._4_4_ = uVar27;
  btf_16_w16_avx2(w0_04,w1_12,&local_560,&local_540,_r_12,cos_bit_00);
  w0_05[0]._4_4_ = iVar15;
  w0_05[0]._0_4_ = iVar9;
  w0_05[1]._0_4_ = iVar16;
  w0_05[1]._4_4_ = iVar17;
  w0_05[2]._0_4_ = iVar18;
  w0_05[2]._4_4_ = iVar19;
  w0_05[3]._0_4_ = iVar20;
  w0_05[3]._4_4_ = iVar21;
  w1_13[2] = lVar12;
  w1_13[0] = in_stack_fffffffffffffa20._0_8_;
  w1_13[1] = in_stack_fffffffffffffa20._8_8_;
  w1_13[3] = (longlong)output;
  _r_13[0]._4_4_ = uVar22;
  _r_13[0]._0_4_ = uVar11;
  _r_13[1]._0_4_ = uVar10;
  _r_13[1]._4_4_ = uVar23;
  _r_13[2]._0_4_ = uVar24;
  _r_13[2]._4_4_ = uVar25;
  _r_13[3]._0_4_ = uVar26;
  _r_13[3]._4_4_ = uVar27;
  btf_16_w16_avx2(w0_05,w1_13,&local_520,&local_500,_r_13,cos_bit_00);
  w0_06[0]._4_4_ = iVar15;
  w0_06[0]._0_4_ = iVar9;
  w0_06[1]._0_4_ = iVar16;
  w0_06[1]._4_4_ = iVar17;
  w0_06[2]._0_4_ = iVar18;
  w0_06[2]._4_4_ = iVar19;
  w0_06[3]._0_4_ = iVar20;
  w0_06[3]._4_4_ = iVar21;
  w1_14[2] = lVar12;
  w1_14[0] = in_stack_fffffffffffffa20._0_8_;
  w1_14[1] = in_stack_fffffffffffffa20._8_8_;
  w1_14[3] = (longlong)output;
  _r_14[0]._4_4_ = uVar22;
  _r_14[0]._0_4_ = uVar11;
  _r_14[1]._0_4_ = uVar10;
  _r_14[1]._4_4_ = uVar23;
  _r_14[2]._0_4_ = uVar24;
  _r_14[2]._4_4_ = uVar25;
  _r_14[3]._0_4_ = uVar26;
  _r_14[3]._4_4_ = uVar27;
  btf_16_w16_avx2(w0_06,w1_14,&local_4e0,&local_4c0,_r_14,cos_bit_00);
  w0_07[0]._4_4_ = iVar15;
  w0_07[0]._0_4_ = iVar9;
  w0_07[1]._0_4_ = iVar16;
  w0_07[1]._4_4_ = iVar17;
  w0_07[2]._0_4_ = iVar18;
  w0_07[2]._4_4_ = iVar19;
  w0_07[3]._0_4_ = iVar20;
  w0_07[3]._4_4_ = iVar21;
  w1_15[2] = lVar12;
  w1_15[0] = in_stack_fffffffffffffa20._0_8_;
  w1_15[1] = in_stack_fffffffffffffa20._8_8_;
  w1_15[3] = (longlong)output;
  _r_15[0]._4_4_ = uVar22;
  _r_15[0]._0_4_ = uVar11;
  _r_15[1]._0_4_ = uVar10;
  _r_15[1]._4_4_ = uVar23;
  _r_15[2]._0_4_ = uVar24;
  _r_15[2]._4_4_ = uVar25;
  _r_15[3]._0_4_ = uVar26;
  _r_15[3]._4_4_ = uVar27;
  btf_16_w16_avx2(w0_07,w1_15,&local_4a0,&local_480,_r_15,cos_bit_00);
  w0_08[0]._4_4_ = iVar15;
  w0_08[0]._0_4_ = iVar9;
  w0_08[1]._0_4_ = iVar16;
  w0_08[1]._4_4_ = iVar17;
  w0_08[2]._0_4_ = iVar18;
  w0_08[2]._4_4_ = iVar19;
  w0_08[3]._0_4_ = iVar20;
  w0_08[3]._4_4_ = iVar21;
  w1_16[2] = lVar12;
  w1_16[0] = in_stack_fffffffffffffa20._0_8_;
  w1_16[1] = in_stack_fffffffffffffa20._8_8_;
  w1_16[3] = (longlong)output;
  _r_16[0]._4_4_ = uVar22;
  _r_16[0]._0_4_ = uVar11;
  _r_16[1]._0_4_ = uVar10;
  _r_16[1]._4_4_ = uVar23;
  _r_16[2]._0_4_ = uVar24;
  _r_16[2]._4_4_ = uVar25;
  _r_16[3]._0_4_ = uVar26;
  _r_16[3]._4_4_ = uVar27;
  btf_16_w16_avx2(w0_08,w1_16,&local_460,&local_440,_r_16,cos_bit_00);
  w0_09[0]._4_4_ = iVar15;
  w0_09[0]._0_4_ = iVar9;
  w0_09[1]._0_4_ = iVar16;
  w0_09[1]._4_4_ = iVar17;
  w0_09[2]._0_4_ = iVar18;
  w0_09[2]._4_4_ = iVar19;
  w0_09[3]._0_4_ = iVar20;
  w0_09[3]._4_4_ = iVar21;
  w1_17[2] = lVar12;
  w1_17[0] = in_stack_fffffffffffffa20._0_8_;
  w1_17[1] = in_stack_fffffffffffffa20._8_8_;
  w1_17[3] = (longlong)output;
  _r_17[0]._4_4_ = uVar22;
  _r_17[0]._0_4_ = uVar11;
  _r_17[1]._0_4_ = uVar10;
  _r_17[1]._4_4_ = uVar23;
  _r_17[2]._0_4_ = uVar24;
  _r_17[2]._4_4_ = uVar25;
  _r_17[3]._0_4_ = uVar26;
  _r_17[3]._4_4_ = uVar27;
  btf_16_w16_avx2(w0_09,w1_17,&local_420,&local_400,_r_17,cos_bit_00);
  w0_10[0]._4_4_ = iVar15;
  w0_10[0]._0_4_ = iVar9;
  w0_10[1]._0_4_ = iVar16;
  w0_10[1]._4_4_ = iVar17;
  w0_10[2]._0_4_ = iVar18;
  w0_10[2]._4_4_ = iVar19;
  w0_10[3]._0_4_ = iVar20;
  w0_10[3]._4_4_ = iVar21;
  w1_18[2] = lVar12;
  w1_18[0] = in_stack_fffffffffffffa20._0_8_;
  w1_18[1] = in_stack_fffffffffffffa20._8_8_;
  w1_18[3] = (longlong)output;
  _r_18[0]._4_4_ = uVar22;
  _r_18[0]._0_4_ = uVar11;
  _r_18[1]._0_4_ = uVar10;
  _r_18[1]._4_4_ = uVar23;
  _r_18[2]._0_4_ = uVar24;
  _r_18[2]._4_4_ = uVar25;
  _r_18[3]._0_4_ = uVar26;
  _r_18[3]._4_4_ = uVar27;
  btf_16_w16_avx2(w0_10,w1_18,&local_3e0,&local_3c0,_r_18,cos_bit_00);
  (*output)[0] = local_580[0];
  (*output)[1] = local_580[1];
  (*output)[2] = local_580[2];
  (*output)[3] = local_580[3];
  output[1][0] = local_3e0[0];
  output[1][1] = local_3e0[1];
  output[1][2] = local_3e0[2];
  output[1][3] = local_3e0[3];
  output[2][0] = local_540[0];
  output[2][1] = local_540[1];
  output[2][2] = local_540[2];
  output[2][3] = local_540[3];
  output[3][0] = local_420[0];
  output[3][1] = local_420[1];
  output[3][2] = local_420[2];
  output[3][3] = local_420[3];
  output[4][0] = local_500[0];
  output[4][1] = local_500[1];
  output[4][2] = local_500[2];
  output[4][3] = local_500[3];
  output[5][0] = local_460[0];
  output[5][1] = local_460[1];
  output[5][2] = local_460[2];
  output[5][3] = local_460[3];
  output[6][0] = local_4c0[0];
  output[6][1] = local_4c0[1];
  output[6][2] = local_4c0[2];
  output[6][3] = local_4c0[3];
  output[7][0] = local_4a0[0];
  output[7][1] = local_4a0[1];
  output[7][2] = local_4a0[2];
  output[7][3] = local_4a0[3];
  output[8][0] = local_480[0];
  output[8][1] = local_480[1];
  output[8][2] = local_480[2];
  output[8][3] = local_480[3];
  output[9][0] = local_4e0[0];
  output[9][1] = local_4e0[1];
  output[9][2] = local_4e0[2];
  output[9][3] = local_4e0[3];
  output[10][0] = local_440[0];
  output[10][1] = local_440[1];
  output[10][2] = local_440[2];
  output[10][3] = local_440[3];
  output[0xb][0] = local_520[0];
  output[0xb][1] = local_520[1];
  output[0xb][2] = local_520[2];
  output[0xb][3] = local_520[3];
  output[0xc][0] = local_400[0];
  output[0xc][1] = local_400[1];
  output[0xc][2] = local_400[2];
  output[0xc][3] = local_400[3];
  output[0xd][0] = local_560[0];
  output[0xd][1] = local_560[1];
  output[0xd][2] = local_560[2];
  output[0xd][3] = local_560[3];
  output[0xe][0] = local_3c0[0];
  output[0xe][1] = local_3c0[1];
  output[0xe][2] = local_3c0[2];
  output[0xe][3] = local_3c0[3];
  output[0xf][0] = local_5a0[0];
  output[0xf][1] = local_5a0[1];
  output[0xf][2] = local_5a0[2];
  output[0xf][3] = local_5a0[3];
  return;
}

Assistant:

static inline void fadst16x16_new_avx2(const __m256i *input, __m256i *output,
                                       int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __zero = _mm256_setzero_si256();
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_m48_p16 = pair_set_w16_epi16(-cospi[48], cospi[16]);
  __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  __m256i cospi_m56_p08 = pair_set_w16_epi16(-cospi[56], cospi[8]);
  __m256i cospi_m24_p40 = pair_set_w16_epi16(-cospi[24], cospi[40]);
  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[0];
  x1[1] = _mm256_subs_epi16(__zero, input[15]);
  x1[2] = _mm256_subs_epi16(__zero, input[7]);
  x1[3] = input[8];
  x1[4] = _mm256_subs_epi16(__zero, input[3]);
  x1[5] = input[12];
  x1[6] = input[4];
  x1[7] = _mm256_subs_epi16(__zero, input[11]);
  x1[8] = _mm256_subs_epi16(__zero, input[1]);
  x1[9] = input[14];
  x1[10] = input[6];
  x1[11] = _mm256_subs_epi16(__zero, input[9]);
  x1[12] = input[2];
  x1[13] = _mm256_subs_epi16(__zero, input[13]);
  x1[14] = _mm256_subs_epi16(__zero, input[5]);
  x1[15] = input[10];

  // stage 2
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[2], &x1[3], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[14], &x1[15], _r, cos_bit);

  // stage 3
  btf_16_adds_subs_avx2(&x1[0], &x1[2]);
  btf_16_adds_subs_avx2(&x1[1], &x1[3]);
  btf_16_adds_subs_avx2(&x1[4], &x1[6]);
  btf_16_adds_subs_avx2(&x1[5], &x1[7]);
  btf_16_adds_subs_avx2(&x1[8], &x1[10]);
  btf_16_adds_subs_avx2(&x1[9], &x1[11]);
  btf_16_adds_subs_avx2(&x1[12], &x1[14]);
  btf_16_adds_subs_avx2(&x1[13], &x1[15]);

  // stage 4
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[4], &x1[5], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_p16, cospi_p16_p48, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[12], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_p16, cospi_p16_p48, &x1[14], &x1[15], _r, cos_bit);

  // stage 5
  btf_16_adds_subs_avx2(&x1[0], &x1[4]);
  btf_16_adds_subs_avx2(&x1[1], &x1[5]);
  btf_16_adds_subs_avx2(&x1[2], &x1[6]);
  btf_16_adds_subs_avx2(&x1[3], &x1[7]);
  btf_16_adds_subs_avx2(&x1[8], &x1[12]);
  btf_16_adds_subs_avx2(&x1[9], &x1[13]);
  btf_16_adds_subs_avx2(&x1[10], &x1[14]);
  btf_16_adds_subs_avx2(&x1[11], &x1[15]);

  // stage 6
  btf_16_w16_avx2(cospi_p08_p56, cospi_p56_m08, &x1[8], &x1[9], _r, cos_bit);
  btf_16_w16_avx2(cospi_p40_p24, cospi_p24_m40, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_p08, cospi_p08_p56, &x1[12], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_p40, cospi_p40_p24, &x1[14], &x1[15], _r, cos_bit);

  // stage 7
  btf_16_adds_subs_avx2(&x1[0], &x1[8]);
  btf_16_adds_subs_avx2(&x1[1], &x1[9]);
  btf_16_adds_subs_avx2(&x1[2], &x1[10]);
  btf_16_adds_subs_avx2(&x1[3], &x1[11]);
  btf_16_adds_subs_avx2(&x1[4], &x1[12]);
  btf_16_adds_subs_avx2(&x1[5], &x1[13]);
  btf_16_adds_subs_avx2(&x1[6], &x1[14]);
  btf_16_adds_subs_avx2(&x1[7], &x1[15]);

  // stage 8
  btf_16_w16_avx2(cospi_p02_p62, cospi_p62_m02, &x1[0], &x1[1], _r, cos_bit);
  btf_16_w16_avx2(cospi_p10_p54, cospi_p54_m10, &x1[2], &x1[3], _r, cos_bit);
  btf_16_w16_avx2(cospi_p18_p46, cospi_p46_m18, &x1[4], &x1[5], _r, cos_bit);
  btf_16_w16_avx2(cospi_p26_p38, cospi_p38_m26, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p34_p30, cospi_p30_m34, &x1[8], &x1[9], _r, cos_bit);
  btf_16_w16_avx2(cospi_p42_p22, cospi_p22_m42, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_p50_p14, cospi_p14_m50, &x1[12], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_p58_p06, cospi_p06_m58, &x1[14], &x1[15], _r, cos_bit);

  // stage 9
  output[0] = x1[1];
  output[1] = x1[14];
  output[2] = x1[3];
  output[3] = x1[12];
  output[4] = x1[5];
  output[5] = x1[10];
  output[6] = x1[7];
  output[7] = x1[8];
  output[8] = x1[9];
  output[9] = x1[6];
  output[10] = x1[11];
  output[11] = x1[4];
  output[12] = x1[13];
  output[13] = x1[2];
  output[14] = x1[15];
  output[15] = x1[0];
}